

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# iutest_util_assertion.hpp
# Opt level: O2

AssertionResult * __thiscall
iuutil::detail::
CmpHelperEqRange<__gnu_cxx::__normal_iterator<int_const*,std::vector<int,std::allocator<int>>>,__gnu_cxx::__normal_iterator<char_const*,std::vector<char,std::allocator<char>>>>
          (AssertionResult *__return_storage_ptr__,detail *this,char *expected_expr,
          char *actual_expr,
          __normal_iterator<const_int_*,_std::vector<int,_std::allocator<int>_>_> b1,
          __normal_iterator<const_int_*,_std::vector<int,_std::allocator<int>_>_> e1,
          __normal_iterator<const_char_*,_std::vector<char,_std::allocator<char>_>_> b2,
          __normal_iterator<const_char_*,_std::vector<char,_std::allocator<char>_>_> e2)

{
  AssertionResult *pAVar1;
  AssertionResult ar;
  char *local_78;
  detail *local_70;
  pointer local_68;
  AssertionResult local_60;
  AssertionResult local_38;
  
  local_78 = expected_expr;
  local_70 = this;
  CmpHelperEqIterator<__gnu_cxx::__normal_iterator<int_const*,std::vector<int,std::allocator<int>>>,__gnu_cxx::__normal_iterator<char_const*,std::vector<char,std::allocator<char>>>>
            (&local_38,(iuutil *)actual_expr,b1,e1,b2,
             (__normal_iterator<const_char_*,_std::vector<char,_std::allocator<char>_>_>)
             e1._M_current);
  if (local_38.m_result == true) {
    (__return_storage_ptr__->m_message)._M_dataplus._M_p =
         (pointer)&(__return_storage_ptr__->m_message).field_2;
    (__return_storage_ptr__->m_message)._M_string_length = 0;
    (__return_storage_ptr__->m_message).field_2._M_local_buf[0] = '\0';
    __return_storage_ptr__->m_result = true;
  }
  else {
    local_60.m_message._M_dataplus._M_p = (pointer)&local_60.m_message.field_2;
    local_60.m_message._M_string_length = 0;
    local_60.m_message.field_2._M_local_buf[0] = '\0';
    local_60.m_result = false;
    pAVar1 = iutest::AssertionResult::operator<<(&local_60,(char (*) [18])"error: Expected: ");
    pAVar1 = iutest::AssertionResult::operator<<(pAVar1,(char **)&local_70);
    pAVar1 = iutest::AssertionResult::operator<<(pAVar1,(char (*) [5])" == ");
    pAVar1 = iutest::AssertionResult::operator<<(pAVar1,&local_78);
    pAVar1 = iutest::AssertionResult::operator<<(pAVar1,(char (*) [12])" \n  Actual:");
    local_68 = local_38.m_message._M_dataplus._M_p;
    pAVar1 = iutest::AssertionResult::operator<<(pAVar1,&local_68);
    iutest::AssertionResult::AssertionResult(__return_storage_ptr__,pAVar1);
    std::__cxx11::string::~string((string *)&local_60);
  }
  std::__cxx11::string::~string((string *)&local_38);
  return __return_storage_ptr__;
}

Assistant:

::iutest::AssertionResult IUTEST_ATTRIBUTE_UNUSED_ CmpHelperEqRange(const char* expected_expr, const char* actual_expr
    , T1 b1, T1 e1, T2 b2, T2 e2)
{
    if( ::iutest::AssertionResult ar = CmpHelperEqIterator(b1, e1, b2, e2) )
    {
        return ::iutest::AssertionSuccess();
    }
    else
    {
        return ::iutest::AssertionFailure() << "error: Expected: " << expected_expr << " == " << actual_expr
            << " \n  Actual:" << GetAssertionResultMessage(ar);
    }
}